

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O0

int slu_mmdelm_(int_t *mdnode,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int_t npv;
  int_t nqnbrs;
  int_t pvnode;
  int_t nxnode;
  int_t jstrt;
  int_t istrt;
  int_t jstop;
  int_t istop;
  int_t xqnbr;
  int_t elmnt;
  int_t rnode;
  int_t nabor;
  int_t j;
  int_t i;
  int_t rlmt;
  int_t rloc;
  int_t link;
  int_t node;
  int_t i__2;
  int_t i__1;
  int *dbakw_local;
  int *dforw_local;
  shortint *dhead_local;
  shortint *adjncy_local;
  int_t *xadj_local;
  int_t *mdnode_local;
  
  marker[(long)*mdnode + -1] = *tag;
  nabor = xadj[(long)*mdnode + -1];
  j = xadj[(long)(*mdnode + 1) + -1] + -1;
  istop = 0;
  i = nabor;
  while ((nabor <= j && (iVar1 = adjncy[(long)nabor + -1], iVar1 != 0))) {
    if (marker[(long)iVar1 + -1] < *tag) {
      marker[(long)iVar1 + -1] = *tag;
      if (dforw[(long)iVar1 + -1] < 0) {
        llist[(long)iVar1 + -1] = istop;
        istop = iVar1;
      }
      else {
        adjncy[(long)i + -1] = iVar1;
        i = i + 1;
      }
    }
    nabor = nabor + 1;
  }
LAB_00117544:
  if (istop < 1) {
    if (i <= j) {
      adjncy[(long)i + -1] = 0;
    }
    rlmt = *mdnode;
    do {
      nabor = xadj[(long)rlmt + -1];
      iVar1 = xadj[(long)(rlmt + 1) + -1];
      while( true ) {
        if (iVar1 + -1 < nabor) {
          return 0;
        }
        iVar2 = adjncy[(long)nabor + -1];
        rlmt = -iVar2;
        if (iVar2 < 0) break;
        if (iVar2 == 0) {
          return 0;
        }
        iVar3 = dbakw[(long)iVar2 + -1];
        if ((iVar3 != 0) && (iVar3 != -*maxint)) {
          iVar4 = dforw[(long)iVar2 + -1];
          if (0 < iVar4) {
            dbakw[(long)iVar4 + -1] = iVar3;
          }
          if (0 < iVar3) {
            dforw[(long)iVar3 + -1] = iVar4;
          }
          if (iVar3 < 0) {
            dhead[(long)-iVar3 + -1] = iVar4;
          }
        }
        iVar3 = xadj[(long)iVar2 + -1];
        iVar4 = xadj[(long)(iVar2 + 1) + -1];
        jstop = iVar3;
        rnode = iVar3;
        while ((rnode <= iVar4 + -1 && (iVar5 = adjncy[(long)rnode + -1], iVar5 != 0))) {
          if (marker[(long)iVar5 + -1] < *tag) {
            adjncy[(long)jstop + -1] = iVar5;
            jstop = jstop + 1;
          }
          rnode = rnode + 1;
        }
        if (jstop - iVar3 < 1) {
          qsize[(long)*mdnode + -1] = qsize[(long)iVar2 + -1] + qsize[(long)*mdnode + -1];
          qsize[(long)iVar2 + -1] = 0;
          marker[(long)iVar2 + -1] = *maxint;
          dforw[(long)iVar2 + -1] = -*mdnode;
          dbakw[(long)iVar2 + -1] = -*maxint;
        }
        else {
          dforw[(long)iVar2 + -1] = (jstop - iVar3) + 1;
          dbakw[(long)iVar2 + -1] = 0;
          adjncy[(long)jstop + -1] = *mdnode;
          if (jstop + 1 <= iVar4 + -1) {
            adjncy[(long)(jstop + 1) + -1] = 0;
          }
        }
        nabor = nabor + 1;
      }
    } while( true );
  }
  adjncy[(long)j + -1] = -istop;
  rlmt = istop;
LAB_00117565:
  rnode = xadj[(long)rlmt + -1];
  iVar1 = xadj[(long)(rlmt + 1) + -1];
  do {
    if (iVar1 + -1 < rnode) {
LAB_00117669:
      istop = llist[(long)istop + -1];
      goto LAB_00117544;
    }
    iVar2 = adjncy[(long)rnode + -1];
    rlmt = -iVar2;
    if (iVar2 < 0) goto LAB_00117565;
    if (iVar2 == 0) goto LAB_00117669;
    if ((marker[(long)iVar2 + -1] < *tag) && (-1 < dforw[(long)iVar2 + -1])) {
      marker[(long)iVar2 + -1] = *tag;
      for (; j <= i; j = xadj[(long)(-adjncy[(long)j + -1] + 1) + -1] + -1) {
        i = xadj[(long)-adjncy[(long)j + -1] + -1];
      }
      adjncy[(long)i + -1] = iVar2;
      i = i + 1;
    }
    rnode = rnode + 1;
  } while( true );
}

Assistant:

int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr, 
	istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */


/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L300;
	}
	if (marker[nabor] >= *tag) {
	    goto L200;
	}
	marker[nabor] = *tag;
	if (dforw[nabor] < 0) {
	    goto L100;
	}
	adjncy[rloc] = nabor;
	++rloc;
	goto L200;
L100:
	llist[nabor] = elmnt;
	elmnt = nabor;
L200:
	;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
	goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
	node = adjncy[j];
	link = -node;
	if (node < 0) {
	    goto L400;
	} else if (node == 0) {
	    goto L900;
	} else {
	    goto L500;
	}
L500:
	if (marker[node] >= *tag || dforw[node] < 0) {
	    goto L800;
	}
	marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
	if (rloc < rlmt) {
	    goto L700;
	}
	link = -adjncy[rlmt];
	rloc = xadj[link];
	rlmt = xadj[link + 1] - 1;
	goto L600;
L700:
	adjncy[rloc] = node;
	++rloc;
L800:
	;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
	adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	rnode = adjncy[i];
	link = -rnode;
	if (rnode < 0) {
	    goto L1100;
	} else if (rnode == 0) {
	    goto L1800;
	} else {
	    goto L1200;
	}
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
	pvnode = dbakw[rnode];
	if (pvnode == 0 || pvnode == -(*maxint)) {
	    goto L1300;
	}
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
	nxnode = dforw[rnode];
	if (nxnode > 0) {
	    dbakw[nxnode] = pvnode;
	}
	if (pvnode > 0) {
	    dforw[pvnode] = nxnode;
	}
	npv = -pvnode;
	if (pvnode < 0) {
	    dhead[npv] = nxnode;
	}
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
	jstrt = xadj[rnode];
	jstop = xadj[rnode + 1] - 1;
	xqnbr = jstrt;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    nabor = adjncy[j];
	    if (nabor == 0) {
		goto L1500;
	    }
	    if (marker[nabor] >= *tag) {
		goto L1400;
	    }
	    adjncy[xqnbr] = nabor;
	    ++xqnbr;
L1400:
	    ;
	}
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
	nqnbrs = xqnbr - jstrt;
	if (nqnbrs > 0) {
	    goto L1600;
	}
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
	qsize[*mdnode] += qsize[rnode];
	qsize[rnode] = 0;
	marker[rnode] = *maxint;
	dforw[rnode] = -(*mdnode);
	dbakw[rnode] = -(*maxint);
	goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
	dforw[rnode] = nqnbrs + 1;
	dbakw[rnode] = 0;
	adjncy[xqnbr] = *mdnode;
	++xqnbr;
	if (xqnbr <= jstop) {
	    adjncy[xqnbr] = 0;
	}

L1700:
	;
    }
L1800:
    return 0;

}